

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

XmlWriter * __thiscall
doctest::anon_unknown_15::XmlWriter::writeAttribute(XmlWriter *this,string *name,char *attribute)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  size_t sVar3;
  char local_71;
  XmlEncode local_70;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (((attribute != (char *)0x0) && (name->_M_string_length != 0)) && (*attribute != '\0')) {
    local_70.m_str._M_dataplus._M_p._0_1_ = 0x20;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(this->m_os,(char *)&local_70,1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
    local_48 = local_38;
    sVar3 = strlen(attribute);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,attribute,attribute + sVar3)
    ;
    paVar1 = &local_70.m_str.field_2;
    local_70.m_str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_48,local_40 + (long)local_48);
    local_70.m_forWhat = ForAttributes;
    operator<<(poVar2,&local_70);
    local_71 = '\"';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_71,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_str._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.m_str._M_dataplus._M_p,
                      local_70.m_str.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, const char* attribute ) {
        if( !name.empty() && attribute && attribute[0] != '\0' )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }